

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.h
# Opt level: O2

void __thiscall
HashTable<FrameDisplayCheckRecord_*,_Memory::JitArenaAllocator>::HashTable
          (HashTable<FrameDisplayCheckRecord_*,_Memory::JitArenaAllocator> *this,
          JitArenaAllocator *allocator,uint tableSize)

{
  DictionaryStats *pDVar1;
  
  this->alloc = allocator;
  this->tableSize = tableSize;
  Init(this);
  pDVar1 = DictionaryStats::Create
                     ("P9HashTableIP23FrameDisplayCheckRecordN6Memory17JitArenaAllocatorEE",
                      tableSize);
  this->stats = pDVar1;
  return;
}

Assistant:

HashTable(TAllocator * allocator, DECLSPEC_GUARD_OVERFLOW uint tableSize) : alloc(allocator), tableSize(tableSize)
    {
        Init();
#if PROFILE_DICTIONARY
        stats = DictionaryStats::Create(typeid(this).name(), tableSize);
#endif
    }